

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_lib.c
# Opt level: O1

int mk_config_set(mk_ctx_t *ctx,...)

{
  char in_AL;
  int iVar1;
  void **ppvVar2;
  void **ppvVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &va[0].overflow_arg_area;
  uVar4 = 8;
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar2 = (void **)((long)local_c8 + uVar5);
    }
    else {
      ppvVar2 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if ((char *)*ppvVar2 == (char *)0x0) {
      return 0;
    }
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x29) {
      uVar4 = uVar4 + 8;
      ppvVar3 = (void **)((long)local_c8 + uVar5);
    }
    else {
      ppvVar3 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if ((char *)*ppvVar3 == (char *)0x0) break;
    iVar1 = mk_config_set_property(ctx->server,(char *)*ppvVar2,(char *)*ppvVar3);
    if (iVar1 != 0) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int mk_config_set(mk_ctx_t *ctx, ...)
{
    int ret;
    char *key;
    char *value;
    va_list va;

    va_start(va, ctx);

    while ((key = va_arg(va, char *))) {
        value = va_arg(va, char *);
        if (!value) {
            /* Wrong parameter */
            va_end(va);
            return -1;
        }

        ret = mk_config_set_property(ctx->server, key, value);
        if (ret != 0) {
            va_end(va);
            return -1;
        }
    }

    va_end(va);
    return 0;
}